

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue JS_IteratorNext2(JSContext *ctx,JSValue enum_obj,JSValue method,int argc,JSValue *argv,
                        int *pdone)

{
  int iVar1;
  JSRefCountHeader *p;
  JSValueUnion JVar2;
  ulong uVar3;
  uint uVar4;
  JSValue JVar5;
  JSValue JVar6;
  JSValueUnion local_28;
  undefined8 uStack_20;
  
  JVar2 = method.u;
  if ((((int)method.tag == -1) && (*(short *)((long)JVar2.ptr + 6) == 0xc)) &&
     (*(char *)((long)JVar2.ptr + 0x41) == '\f')) {
    if (argc == 0) {
      argv = (JSValue *)&local_28;
      local_28.int32 = 0;
      uStack_20 = 3;
    }
    JVar5 = (JSValue)(**(code **)((long)JVar2.ptr + 0x38))
                               (ctx,enum_obj.u.float64,enum_obj.tag,argc,argv,pdone,
                                (int)*(short *)((long)JVar2.ptr + 0x42));
    uVar3 = (ulong)JVar5.u.ptr & 0xffffffff00000000;
  }
  else {
    local_28.int32 = 0;
    uStack_20 = 3;
    JVar5.tag = 3;
    JVar5.u.ptr = (void *)((ulong)(uint)local_28._4_4_ << 0x20);
    JVar5 = JS_CallInternal(ctx,method,enum_obj,JVar5,argc,argv,2);
    JVar2 = JVar5.u;
    uVar4 = (uint)JVar5.tag;
    if (uVar4 == 0xffffffff) {
      *pdone = 2;
      uVar3 = (ulong)JVar2.ptr & 0xffffffff00000000;
    }
    else {
      if (uVar4 != 6) {
        if ((0xfffffff4 < uVar4) && (iVar1 = *JVar2.ptr, *(int *)JVar2.ptr = iVar1 + -1, iVar1 < 2))
        {
          __JS_FreeValueRT(ctx->rt,JVar5);
        }
        JS_ThrowTypeError(ctx,"iterator must return an object");
      }
      *pdone = 0;
      JVar5 = (JSValue)(ZEXT816(6) << 0x40);
      uVar3 = 0;
    }
  }
  JVar6.tag = JVar5.tag;
  JVar6.u.ptr = (void *)(JVar5.u._0_4_ | uVar3);
  return JVar6;
}

Assistant:

static JSValue JS_IteratorNext2(JSContext *ctx, JSValueConst enum_obj,
                                JSValueConst method,
                                int argc, JSValueConst *argv, int *pdone)
{
    JSValue obj;

    /* fast path for the built-in iterators (avoid creating the
       intermediate result object) */
    if (JS_IsObject(method)) {
        JSObject *p = JS_VALUE_GET_OBJ(method);
        if (p->class_id == JS_CLASS_C_FUNCTION &&
            p->u.cfunc.cproto == JS_CFUNC_iterator_next) {
            JSCFunctionType func;
            JSValueConst args[1];

            /* in case the function expects one argument */
            if (argc == 0) {
                args[0] = JS_UNDEFINED;
                argv = args;
            }
            func = p->u.cfunc.c_function;
            return func.iterator_next(ctx, enum_obj, argc, argv,
                                      pdone, p->u.cfunc.magic);
        }
    }
    obj = JS_Call(ctx, method, enum_obj, argc, argv);
    if (JS_IsException(obj))
        goto fail;
    if (!JS_IsObject(obj)) {
        JS_FreeValue(ctx, obj);
        JS_ThrowTypeError(ctx, "iterator must return an object");
        goto fail;
    }
    *pdone = 2;
    return obj;
 fail:
    *pdone = FALSE;
    return JS_EXCEPTION;
}